

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

void ts_subtree_set_children
               (MutableSubtree self,Subtree *children,uint32_t child_count,TSLanguage *language)

{
  ushort uVar1;
  Subtree *__ptr;
  Subtree SVar2;
  SubtreeHeapData *pSVar3;
  TSStateId TVar4;
  _Bool _Var5;
  byte bVar9;
  uint32_t uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  uint32_t uVar10;
  int iVar11;
  SubtreeHeapData *pSVar12;
  anon_struct_4_2_f6059b32_for_first_leaf *paVar13;
  TSStateId *pTVar14;
  uint32_t uVar15;
  uint uVar16;
  uint32_t uVar17;
  ulong uVar18;
  uint32_t i;
  uint uVar19;
  bool bVar20;
  Length LVar21;
  uint local_88;
  uint local_84;
  uint32_t local_80;
  int local_6c;
  TSSymbol *local_60;
  
  if (((ulong)self.ptr & 1) != 0) {
    __assert_fail("!self.data.is_inline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                  ,0x15b,
                  "void ts_subtree_set_children(MutableSubtree, Subtree *, uint32_t, const TSLanguage *)"
                 );
  }
  if (((self.ptr)->child_count != 0) &&
     (__ptr = ((self.ptr)->field_17).field_0.children, __ptr != children)) {
    free(__ptr);
  }
  (self.ptr)->child_count = child_count;
  ((self.ptr)->field_17).field_0.children = children;
  (self.ptr)->error_cost = 0;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 8) = 0;
  *(undefined8 *)((long)&(self.ptr)->field_17 + 0x10) = 1;
  local_88 = *(ushort *)&(self.ptr)->field_0x2c & 0xffffffbf;
  *(short *)&(self.ptr)->field_0x2c = (short)local_88;
  ((self.ptr)->field_17).field_0.dynamic_precedence = 0;
  TVar4 = TS_TREE_STATE_NONE;
  uVar18 = (ulong)((self.ptr)->field_17).field_0.alias_sequence_id;
  uVar8 = 0;
  if (uVar18 == 0) {
    local_60 = (TSSymbol *)0x0;
  }
  else {
    local_60 = language->alias_sequences + language->max_alias_sequence_length * uVar18;
  }
  uVar17 = 1;
  local_80 = 0;
  local_6c = 0;
  uVar10 = 0;
  local_84 = 0;
  uVar19 = 0;
  for (uVar18 = 0; child_count != uVar18; uVar18 = uVar18 + 1) {
    SVar2 = (Subtree)children[uVar18].ptr;
    if (uVar18 == 0) {
      LVar21 = ts_subtree_padding(SVar2);
      uVar6 = LVar21.bytes;
      (self.ptr)->padding = LVar21;
      LVar21 = ts_subtree_size(SVar2);
      uVar15 = LVar21.bytes;
      (self.ptr)->size = LVar21;
    }
    else {
      LVar21 = ts_subtree_total_size(SVar2);
      LVar21 = length_add((self.ptr)->size,LVar21);
      uVar15 = LVar21.bytes;
      (self.ptr)->size = LVar21;
      uVar6 = ((self.ptr)->padding).bytes;
    }
    if (((ulong)SVar2.ptr & 1) == 0) {
      uVar16 = uVar15 + uVar6 + (SVar2.ptr)->lookahead_bytes;
      if (uVar16 <= local_84) {
        uVar16 = local_84;
      }
      if ((SVar2.ptr)->symbol != 0xfffe) goto LAB_001190ff;
LAB_0011911c:
      if ((SVar2.ptr)->child_count == 0) {
        iVar7 = 0;
      }
      else {
        iVar7 = ((SVar2.ptr)->field_17).field_0.dynamic_precedence;
      }
      local_6c = local_6c + iVar7;
      ((self.ptr)->field_17).field_0.dynamic_precedence = local_6c;
      if ((SVar2.ptr)->child_count == 0) goto LAB_00119149;
      uVar6 = ((SVar2.ptr)->field_17).field_0.node_count;
      local_84 = uVar16;
    }
    else {
      uVar16 = uVar15 + uVar6 + (SVar2._4_4_ >> 0xc & 0xf);
      if (uVar16 <= local_84) {
        uVar16 = local_84;
      }
LAB_001190ff:
      uVar6 = ts_subtree_error_cost(SVar2);
      uVar10 = uVar10 + uVar6;
      (self.ptr)->error_cost = uVar10;
      if (((ulong)SVar2.ptr & 1) == 0) goto LAB_0011911c;
LAB_00119149:
      uVar6 = 1;
      local_84 = uVar16;
    }
    uVar17 = uVar17 + uVar6;
    ((self.ptr)->field_17).field_0.node_count = uVar17;
    if (((local_60 == (TSSymbol *)0x0) || (local_60[uVar19] == 0)) ||
       (_Var5 = ts_subtree_extra(SVar2), _Var5)) {
      if (((ulong)SVar2.ptr & 1) == 0) {
        if (((SVar2.ptr)->field_0x2c & 1) != 0) goto LAB_001191c6;
        if ((SVar2.ptr)->child_count != 0) {
          local_80 = local_80 + ((SVar2.ptr)->field_17).field_0.visible_child_count;
          ((self.ptr)->field_17).field_0.visible_child_count = local_80;
          uVar8 = uVar8 + ((SVar2.ptr)->field_17).field_0.named_child_count;
          ((self.ptr)->field_17).field_0.named_child_count = uVar8;
        }
        goto LAB_0011922a;
      }
      if (((ulong)SVar2.ptr & 2) != 0) {
LAB_001191c6:
        ((self.ptr)->field_17).field_0.visible_child_count = local_80 + 1;
        _Var5 = ts_subtree_named(SVar2);
        if (_Var5) goto LAB_00119215;
        goto LAB_00119224;
      }
    }
    else {
      ((self.ptr)->field_17).field_0.visible_child_count = local_80 + 1;
      uVar1 = local_60[uVar19];
      if ((uVar1 != 0xfffe) &&
         ((uVar1 == 0xffff || (((byte)language->symbol_metadata[uVar1] & 2) != 0)))) {
LAB_00119215:
        uVar8 = uVar8 + 1;
        ((self.ptr)->field_17).field_0.named_child_count = uVar8;
      }
LAB_00119224:
      local_80 = local_80 + 1;
      if (((ulong)SVar2.ptr & 1) == 0) {
LAB_0011922a:
        if (((SVar2.ptr)->field_0x2c & 0x40) != 0) {
          local_88 = local_88 | 0x40;
          *(short *)&(self.ptr)->field_0x2c = (short)local_88;
        }
        if ((SVar2.ptr)->symbol == 0xffff) {
          local_88 = local_88 | 0x18;
          *(short *)&(self.ptr)->field_0x2c = (short)local_88;
          (self.ptr)->parse_state = TVar4;
        }
      }
    }
    _Var5 = ts_subtree_extra(SVar2);
    uVar19 = uVar19 + !_Var5;
  }
  uVar8 = ((self.ptr)->size).bytes;
  (self.ptr)->lookahead_bytes = local_84 - (((self.ptr)->padding).bytes + uVar8);
  uVar1 = (self.ptr)->symbol;
  if (0xfffd < uVar1) {
    uVar8 = uVar10 + uVar8 + ((self.ptr)->size).extent.row * 0x1e + 500;
    (self.ptr)->error_cost = uVar8;
    for (uVar18 = 0; child_count != uVar18; uVar18 = uVar18 + 1) {
      SVar2 = (Subtree)children[uVar18].ptr;
      bVar20 = true;
      if (((ulong)SVar2.ptr & 1) == 0) {
        bVar20 = (SVar2.ptr)->child_count == 0;
      }
      _Var5 = ts_subtree_extra(SVar2);
      if (!_Var5) {
        if (((ulong)SVar2.ptr & 1) == 0) {
          if ((bool)((SVar2.ptr)->symbol == 0xffff & bVar20)) goto LAB_00119326;
          uVar19 = (uint)*(ushort *)&(SVar2.ptr)->field_0x2c;
        }
        else {
          uVar19 = (uint)((ulong)SVar2.ptr >> 1) & 0x7fffffff;
        }
        iVar11 = 100;
        if ((uVar19 & 1) == 0) {
          if (bVar20) goto LAB_00119326;
          iVar11 = ((SVar2.ptr)->field_17).field_0.visible_child_count * 100;
        }
        uVar8 = uVar8 + iVar11;
        (self.ptr)->error_cost = uVar8;
      }
LAB_00119326:
    }
  }
  if (child_count == 0) {
    return;
  }
  pSVar3 = children->ptr;
  pSVar12 = children[child_count - 1].ptr;
  bVar9 = (byte)((ulong)pSVar3 >> 8);
  if (((ulong)pSVar3 & 1) == 0) {
    paVar13 = &(pSVar3->field_17).field_0.first_leaf;
    if (pSVar3->child_count == 0) {
      paVar13 = (anon_struct_4_2_f6059b32_for_first_leaf *)&pSVar3->symbol;
    }
    ((self.ptr)->field_17).field_0.first_leaf.symbol = paVar13->symbol;
    pTVar14 = &(pSVar3->field_17).field_0.first_leaf.parse_state;
    if (pSVar3->child_count == 0) {
      pTVar14 = &pSVar3->parse_state;
    }
    ((self.ptr)->field_17).field_0.first_leaf.parse_state = *pTVar14;
    if ((pSVar3->field_0x2c & 8) != 0) {
      local_88 = local_88 | 8;
      *(short *)&(self.ptr)->field_0x2c = (short)local_88;
    }
  }
  else {
    *(ushort *)((long)&(self.ptr)->field_17 + 0x1e) = (ushort)bVar9;
    ((self.ptr)->field_17).field_0.first_leaf.parse_state = (TSStateId)((ulong)pSVar3 >> 0x30);
  }
  if ((((ulong)pSVar12 & 1) == 0) && ((pSVar12->field_0x2c & 0x10) != 0)) {
    local_88 = local_88 | 0x10;
    *(short *)&(self.ptr)->field_0x2c = (short)local_88;
  }
  if (child_count == 1) {
    return;
  }
  if (((local_88 >> 1 | local_88) & 1) != 0) {
    return;
  }
  if (((ulong)pSVar3 & 1) == 0) {
    if (pSVar3->symbol != uVar1) {
      return;
    }
    if (pSVar3->child_count == 0) goto LAB_001193f2;
    uVar19 = (pSVar3->field_17).field_0.repeat_depth;
  }
  else {
    if (bVar9 != uVar1) {
      return;
    }
LAB_001193f2:
    uVar19 = 0;
  }
  if ((((ulong)pSVar12 & 1) == 0) && (pSVar12->child_count != 0)) {
    if (uVar19 <= (pSVar12->field_17).field_0.repeat_depth) {
LAB_0011941f:
      uVar8 = (pSVar12->field_17).field_0.repeat_depth + 1;
      goto LAB_00119429;
    }
    if (((ulong)pSVar3 & 1) == 0) goto LAB_00119416;
  }
  else if (uVar19 != 0 && ((ulong)pSVar3 & 1) == 0) {
LAB_00119416:
    pSVar12 = pSVar3;
    if (pSVar3->child_count != 0) goto LAB_0011941f;
  }
  uVar8 = 1;
LAB_00119429:
  ((self.ptr)->field_17).field_0.repeat_depth = uVar8;
  return;
}

Assistant:

void ts_subtree_set_children(
  MutableSubtree self, Subtree *children, uint32_t child_count, const TSLanguage *language
) {
  assert(!self.data.is_inline);

  if (self.ptr->child_count > 0 && children != self.ptr->children) {
    ts_free(self.ptr->children);
  }

  self.ptr->child_count = child_count;
  self.ptr->children = children;
  self.ptr->named_child_count = 0;
  self.ptr->visible_child_count = 0;
  self.ptr->error_cost = 0;
  self.ptr->repeat_depth = 0;
  self.ptr->node_count = 1;
  self.ptr->has_external_tokens = false;
  self.ptr->dynamic_precedence = 0;

  uint32_t non_extra_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
  uint32_t lookahead_end_byte = 0;

  for (uint32_t i = 0; i < self.ptr->child_count; i++) {
    Subtree child = self.ptr->children[i];

    if (i == 0) {
      self.ptr->padding = ts_subtree_padding(child);
      self.ptr->size = ts_subtree_size(child);
    } else {
      self.ptr->size = length_add(self.ptr->size, ts_subtree_total_size(child));
    }

    uint32_t child_lookahead_end_byte =
      self.ptr->padding.bytes +
      self.ptr->size.bytes +
      ts_subtree_lookahead_bytes(child);
    if (child_lookahead_end_byte > lookahead_end_byte) lookahead_end_byte = child_lookahead_end_byte;

    if (ts_subtree_symbol(child) != ts_builtin_sym_error_repeat) {
      self.ptr->error_cost += ts_subtree_error_cost(child);
    }

    self.ptr->dynamic_precedence += ts_subtree_dynamic_precedence(child);
    self.ptr->node_count += ts_subtree_node_count(child);

    if (alias_sequence && alias_sequence[non_extra_index] != 0 && !ts_subtree_extra(child)) {
      self.ptr->visible_child_count++;
      if (ts_language_symbol_metadata(language, alias_sequence[non_extra_index]).named) {
        self.ptr->named_child_count++;
      }
    } else if (ts_subtree_visible(child)) {
      self.ptr->visible_child_count++;
      if (ts_subtree_named(child)) self.ptr->named_child_count++;
    } else if (ts_subtree_child_count(child) > 0) {
      self.ptr->visible_child_count += child.ptr->visible_child_count;
      self.ptr->named_child_count += child.ptr->named_child_count;
    }

    if (ts_subtree_has_external_tokens(child)) self.ptr->has_external_tokens = true;

    if (ts_subtree_is_error(child)) {
      self.ptr->fragile_left = self.ptr->fragile_right = true;
      self.ptr->parse_state = TS_TREE_STATE_NONE;
    }

    if (!ts_subtree_extra(child)) non_extra_index++;
  }

  self.ptr->lookahead_bytes = lookahead_end_byte - self.ptr->size.bytes - self.ptr->padding.bytes;

  if (self.ptr->symbol == ts_builtin_sym_error || self.ptr->symbol == ts_builtin_sym_error_repeat) {
    self.ptr->error_cost +=
      ERROR_COST_PER_RECOVERY +
      ERROR_COST_PER_SKIPPED_CHAR * self.ptr->size.bytes +
      ERROR_COST_PER_SKIPPED_LINE * self.ptr->size.extent.row;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      uint32_t grandchild_count = ts_subtree_child_count(child);
      if (ts_subtree_extra(child)) continue;
      if (ts_subtree_is_error(child) && grandchild_count == 0) continue;
      if (ts_subtree_visible(child)) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE;
      } else if (grandchild_count > 0) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE * child.ptr->visible_child_count;
      }
    }
  }

  if (self.ptr->child_count > 0) {
    Subtree first_child = self.ptr->children[0];
    Subtree last_child = self.ptr->children[self.ptr->child_count - 1];

    self.ptr->first_leaf.symbol = ts_subtree_leaf_symbol(first_child);
    self.ptr->first_leaf.parse_state = ts_subtree_leaf_parse_state(first_child);

    if (ts_subtree_fragile_left(first_child)) self.ptr->fragile_left = true;
    if (ts_subtree_fragile_right(last_child)) self.ptr->fragile_right = true;

    if (
      self.ptr->child_count >= 2 &&
      !self.ptr->visible &&
      !self.ptr->named &&
      ts_subtree_symbol(first_child) == self.ptr->symbol
    ) {
      if (ts_subtree_repeat_depth(first_child) > ts_subtree_repeat_depth(last_child)) {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(first_child) + 1;
      } else {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(last_child) + 1;
      }
    }
  }
}